

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O1

optional<cmStandardLevel> __thiscall
anon_unknown.dwarf_dce6e1::StandardLevelComputer::CompileFeatureStandardLevel
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  pointer pbVar1;
  pointer pcVar2;
  _Storage<cmStandardLevel,_true> _Var3;
  cmValue cVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  uint uVar6;
  long lVar7;
  _Storage<cmStandardLevel,_true> _Var8;
  optional<cmStandardLevel> oVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList props;
  string prefix;
  ulong local_d8;
  _Storage<cmStandardLevel,_true> local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  string *local_60;
  cmMakefile *local_58;
  string local_50;
  
  local_a8._M_dataplus._M_p = (pointer)0x6;
  local_a8._M_string_length = 0x8b1c7e;
  local_a8.field_2._M_allocated_capacity = 0;
  local_88 = (this->Language)._M_dataplus._M_p;
  local_a8.field_2._8_8_ = (this->Language)._M_string_length;
  local_80 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_a8;
  local_60 = feature;
  local_58 = makefile;
  cmCatViews(&local_50,views);
  if ((this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_d8 = 0;
  }
  else {
    lVar7 = 8;
    _Var8 = (_Storage<cmStandardLevel,_true>)0x0;
    local_d8 = 0;
    do {
      pbVar1 = (this->LevelsAsStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a8._M_dataplus._M_p = (pointer)local_50._M_string_length;
      local_a8._M_string_length = (size_type)local_50._M_dataplus._M_p;
      local_a8.field_2._M_allocated_capacity = 0;
      local_88 = *(pointer *)((long)pbVar1 + lVar7 + -8);
      local_a8.field_2._8_8_ = *(size_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar7);
      local_80 = 0;
      local_78 = 0x11;
      local_70 = "_COMPILE_FEATURES";
      local_68 = 0;
      views_00._M_len = 3;
      views_00._M_array = (iterator)&local_a8;
      cmCatViews(&local_c8,views_00);
      cVar4 = cmMakefile::GetDefinition(local_58,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if (cVar4.Value != (string *)0x0) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
        init._M_len = 1;
        init._M_array = &local_a8;
        cmList::cmList((cmList *)&local_c8,init);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        _Var5 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_c8._M_dataplus._M_p,local_c8._M_string_length,local_60);
        uVar6 = 1;
        if (local_d8 != 0) {
          uVar6 = (uint)(byte)local_d8;
        }
        _Var3 = _Var8;
        if (_Var5._M_current ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_c8._M_string_length) {
          uVar6 = (uint)(byte)local_d8;
          _Var3 = local_d0;
        }
        local_d0 = _Var3;
        local_d8 = (ulong)uVar6;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8);
      }
      _Var8 = (_Storage<cmStandardLevel,_true>)((long)_Var8 + 1);
      lVar7 = lVar7 + 0x20;
    } while ((ulong)_Var8 <
             (ulong)((long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  oVar9.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._8_8_ = local_d8;
  oVar9.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
  super__Optional_payload_base<cmStandardLevel>._M_payload = local_d0;
  return (optional<cmStandardLevel>)
         oVar9.super__Optional_base<cmStandardLevel,_true,_true>._M_payload.
         super__Optional_payload_base<cmStandardLevel>;
}

Assistant:

cm::optional<cmStandardLevel> CompileFeatureStandardLevel(
    cmMakefile* makefile, std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    cm::optional<cmStandardLevel> maxLevel;
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        cmList props{ *prop };
        if (cm::contains(props, feature)) {
          maxLevel = cmStandardLevel(i);
        }
      }
    }
    return maxLevel;
  }